

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O0

timestamp_t
duckdb::HandleVectorCastError::Operation<duckdb::timestamp_t>
          (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  timestamp_t tVar1;
  CastParameters *in_RCX;
  string *in_RDX;
  
  HandleCastError::AssignError(in_RDX,in_RCX);
  *(undefined1 *)&in_RCX->error_message = 0;
  TemplatedValidityMask<unsigned_long>::SetInvalid
            ((TemplatedValidityMask<unsigned_long> *)in_RDX,(idx_t)in_RCX);
  tVar1 = NullValue<duckdb::timestamp_t>();
  return (timestamp_t)tVar1.value;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}